

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-summon.c
# Opt level: O2

_Bool can_call_monster(loc grid,monster *mon)

{
  _Bool _Var1;
  
  if ((mon->race != (monster_race *)0x0) && (_Var1 = summon_specific_okay(mon->race), _Var1)) {
    _Var1 = los(cave,(loc_conflict)grid,mon->grid);
    return !_Var1;
  }
  return false;
}

Assistant:

static bool can_call_monster(struct loc grid, struct monster *mon)
{
	/* Skip dead monsters */
	if (!mon->race) return (false);

	/* Only consider callable monsters */
	if (!summon_specific_okay(mon->race)) return (false);

	/* Make sure the summoned monster is not in LOS of the summoner */
	if (los(cave, grid, mon->grid)) return (false);

	return (true);
}